

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassesAndEnums
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  ulong uVar1;
  int i;
  long lVar2;
  Generator *this_00;
  int i_2;
  long lVar3;
  
  lVar3 = 0;
  this_00 = this;
  for (lVar2 = 0; uVar1 = (ulong)*(int *)(file + 0x2c), lVar2 < (long)uVar1; lVar2 = lVar2 + 1) {
    this_00 = this;
    GenerateClassConstructorAndDeclareExtensionFieldInfo
              (this,options,printer,(Descriptor *)(*(long *)(file + 0x68) + lVar3));
    lVar3 = lVar3 + 0x90;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
    this_00 = this;
    GenerateClass(this,options,printer,(Descriptor *)(*(long *)(file + 0x68) + lVar3));
    uVar1 = (ulong)*(uint *)(file + 0x2c);
    lVar3 = lVar3 + 0x90;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(file + 0x30); lVar3 = lVar3 + 1) {
    GenerateEnum(this_00,options,printer,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar2));
    lVar2 = lVar2 + 0x50;
  }
  return;
}

Assistant:

void Generator::GenerateClassesAndEnums(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const FileDescriptor* file) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClassConstructorAndDeclareExtensionFieldInfo(options, printer,
                                                         file->message_type(i));
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClass(options, printer, file->message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(options, printer, file->enum_type(i));
  }
}